

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

void jx9_context_free_chunk(jx9_context *pCtx,void *pChunk)

{
  jx9_aux_data *pjVar1;
  
  if (pChunk != (void *)0x0) {
    pjVar1 = ContextFindChunk(pCtx,pChunk);
    if (pjVar1 != (jx9_aux_data *)0x0) {
      pjVar1->pAuxData = (void *)0x0;
    }
    SyMemBackendFree(&pCtx->pVm->sAllocator,pChunk);
    return;
  }
  return;
}

Assistant:

JX9_PRIVATE void jx9_context_free_chunk(jx9_context *pCtx, void *pChunk)
{
	jx9_aux_data *pAux;
	if( pChunk == 0 ){
		/* TICKET-1433-93: NULL chunk is a harmless operation */
		return;
	}
	pAux = ContextFindChunk(pCtx, pChunk);
	if( pAux ){
		/* Mark as destroyed */
		pAux->pAuxData = 0;
	}
	SyMemBackendFree(&pCtx->pVm->sAllocator, pChunk);
}